

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O1

int simplify_branch_branch(dmr_C *C,basic_block *bb,instruction *br,basic_block **target_p,int true)

{
  basic_block *bb_00;
  basic_block *target;
  int iVar1;
  int iVar2;
  instruction *jmp;
  
  bb_00 = *target_p;
  iVar1 = 0;
  if (bb_00 != bb) {
    jmp = (instruction *)ptrlist_last((ptr_list *)bb_00->insns);
    if (((jmp == (instruction *)0x0) || (*(char *)jmp != '\x04')) ||
       ((jmp->field_5).target != (br->field_5).target)) {
      iVar1 = 0;
    }
    else {
      target = *(basic_block **)((long)&jmp->field_6 + (ulong)(true == 0) * 8);
      iVar1 = bb_has_side_effects(bb_00);
      if ((iVar1 == 0) && (iVar1 = bb_depends_on(target,bb_00), iVar1 == 0)) {
        iVar1 = bb_depends_on_phi(target,bb_00);
        if (iVar1 != 0) {
          return 0;
        }
        iVar1 = rewrite_branch(C,bb,target_p,bb_00,target);
        return iVar1;
      }
      iVar2 = ptrlist_size((ptr_list *)bb_00->parents);
      iVar1 = 0;
      if (iVar2 == 1) {
        dmrC_insert_branch(C,bb_00,jmp,target);
        iVar1 = 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int simplify_branch_branch(struct dmr_C *C, struct basic_block *bb, struct instruction *br,
	struct basic_block **target_p, int true)
{
	struct basic_block *target = *target_p, *final;
	struct instruction *insn;
	int retval;

	if (target == bb)
		return 0;
	insn = dmrC_last_instruction(target->insns);
	if (!insn || insn->opcode != OP_CBR || insn->cond != br->cond)
		return 0;
	/*
	 * Ahhah! We've found a branch to a branch on the same conditional!
	 * Now we just need to see if we can rewrite the branch..
	 */
	retval = 0;
	final = true ? insn->bb_true : insn->bb_false;
	if (bb_has_side_effects(target))
		goto try_to_rewrite_target;
	if (bb_depends_on(final, target))
		goto try_to_rewrite_target;
	if (bb_depends_on_phi(final, target))
		return 0;
	return rewrite_branch(C, bb, target_p, target, final);

try_to_rewrite_target:
	/*
	 * If we're the only parent, at least we can rewrite the
	 * now-known second branch.
	 */
	if (dmrC_bb_list_size(target->parents) != 1)
		return retval;
	dmrC_insert_branch(C, target, insn, final);
	return 1;
}